

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

string * __thiscall
flatbuffers::go::GoGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  BaseType BVar1;
  string local_98;
  string local_78;
  Type local_58;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  GoGenerator *this_local;
  
  BVar1 = type->base_type;
  local_20 = type;
  type_local = (Type *)this;
  this_local = (GoGenerator *)__return_storage_ptr__;
  if (BVar1 == BASE_TYPE_STRING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rcv._tab.ByteVector",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else if (BVar1 == BASE_TYPE_VECTOR) {
    Type::VectorType(&local_58,type);
    GenGetter_abi_cxx11_(__return_storage_ptr__,this,&local_58);
  }
  else if (BVar1 == BASE_TYPE_UNION) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rcv._tab.Union",local_35);
    std::allocator<char>::~allocator(local_35);
  }
  else {
    GenTypeBasic_abi_cxx11_(&local_98,this,type);
    Namer::Function(&local_78,&(this->namer_).super_Namer,&local_98);
    std::operator+(__return_storage_ptr__,"rcv._tab.Get",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "rcv._tab.ByteVector";
      case BASE_TYPE_UNION: return "rcv._tab.Union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default: return "rcv._tab.Get" + namer_.Function(GenTypeBasic(type));
    }
  }